

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leccalc.cpp
# Opt level: O0

void leccalc::loadoccurrence
               (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                *event_to_periods,int *totalperiods)

{
  FILE *__stream;
  undefined1 local_44 [8];
  occurrence occ_1;
  occurrence_granular occ;
  int granular_date;
  int date_opts;
  FILE *fin;
  int *totalperiods_local;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *event_to_periods_local;
  
  __stream = fopen("input/occurrence.bin","rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"FATAL: Error reading file %s\n","input/occurrence.bin");
    exit(-1);
  }
  occ.occ_date_id._4_4_ = 0;
  fread((void *)((long)&occ.occ_date_id + 4),4,1,__stream);
  fread(totalperiods,4,1,__stream);
  occ.occ_date_id._0_4_ = occ.occ_date_id._4_4_ >> 1;
  if ((int)occ.occ_date_id == 0) {
    loadoccurrence<occurrence>(event_to_periods,(occurrence *)local_44,(FILE *)__stream);
  }
  else {
    loadoccurrence<occurrence_granular>
              (event_to_periods,(occurrence_granular *)&occ_1.period_no,(FILE *)__stream);
  }
  fclose(__stream);
  return;
}

Assistant:

void loadoccurrence(std::map<int, std::vector<int> >& event_to_periods,
			    int& totalperiods)
	{
		FILE* fin = fopen(OCCURRENCE_FILE, "rb");
		if (fin == NULL) {
			fprintf(stderr, "FATAL: Error reading file %s\n",
				OCCURRENCE_FILE);
			exit(-1);
		}

		int date_opts = 0;
		fread(&date_opts, sizeof(date_opts), 1, fin);
		fread(&totalperiods, sizeof(totalperiods), 1, fin);
		int granular_date = date_opts >> 1;
		if (granular_date) {
			occurrence_granular occ;
			loadoccurrence(event_to_periods, occ, fin);
		} else {
			occurrence occ;
			loadoccurrence(event_to_periods, occ, fin);
		}

		fclose(fin);
	}